

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O0

void anon_unknown.dwarf_d28b::showHelp(void)

{
  std::operator<<((ostream *)&std::cout,
                  "brecovery -- extract unconsumed binlog data from a memory dump\n\nSynopsis:\n  brecovery corefile [outputfile]\n\nArguments:\n  corefile        Path to a corefile (memory dump)\n  outputfile      Path to write recovered data. If \'-\' or unspecified, read from stdin\n\nNotes:\n  Recovery is done by looking for \'magic numbers\' in the corefile,\n  and extracting structured data following those. Metadata and unconsumed data\n  are extracted from each session, and written to the output.\n  The output is a valid binlog logfile (if it was not corrupted previously),\n  and can be read using bread:\n\n    $ brecovery app.core recovered.blog\n    $ bread recovered.blog\n\nReport bugs to:\n  https://github.com/Morgan-Stanley/binlog/issues\n"
                 );
  return;
}

Assistant:

void showHelp()
{
  std::cout <<
    "brecovery -- extract unconsumed binlog data from a memory dump\n"
    "\n"
    "Synopsis:\n"
    "  brecovery corefile [outputfile]\n"
    "\n"
    "Arguments:\n"
    "  corefile        Path to a corefile (memory dump)\n"
    "  outputfile      Path to write recovered data. If '-' or unspecified, read from stdin\n"
    "\n"
    "Notes:\n"
    "  Recovery is done by looking for 'magic numbers' in the corefile,\n"
    "  and extracting structured data following those. Metadata and unconsumed data\n"
    "  are extracted from each session, and written to the output.\n"
    "  The output is a valid binlog logfile (if it was not corrupted previously),\n"
    "  and can be read using bread:\n"
    "\n"
    "    $ brecovery app.core recovered.blog\n"
    "    $ bread recovered.blog\n"
    "\n"
    "Report bugs to:\n"
    "  https://github.com/Morgan-Stanley/binlog/issues\n";
    ;
}